

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

uint __thiscall crnlib::symbol_codec::decode(symbol_codec *this,adaptive_huffman_data_model *model)

{
  uint *puVar1;
  ushort uVar2;
  int iVar3;
  decoder_tables *pdVar4;
  unsigned_short *puVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  byte *pbVar14;
  
  pdVar4 = model->m_pDecode_tables;
  iVar12 = this->m_bit_count;
  if (iVar12 < 0x18) {
    do {
      pbVar14 = this->m_pDecode_buf_next;
      if (pbVar14 == this->m_pDecode_buf_end) {
        uVar10 = 0;
        if (this->m_decode_buf_eof == false) {
          (*this->m_pDecode_need_bytes_func)
                    ((long)pbVar14 - (long)this->m_pDecode_buf,this->m_pDecode_private_data,
                     &this->m_pDecode_buf,&this->m_decode_buf_size,&this->m_decode_buf_eof);
          pbVar14 = this->m_pDecode_buf;
          this->m_pDecode_buf_end = pbVar14 + this->m_decode_buf_size;
          this->m_pDecode_buf_next = pbVar14;
          if (0 < (long)this->m_decode_buf_size) goto LAB_001992d9;
        }
      }
      else {
LAB_001992d9:
        this->m_pDecode_buf_next = pbVar14 + 1;
        uVar10 = (uint)*pbVar14;
      }
      iVar3 = this->m_bit_count;
      iVar12 = iVar3 + 8;
      this->m_bit_count = iVar12;
      this->m_bit_buf = this->m_bit_buf | uVar10 << (0x18U - (char)iVar3 & 0x1f);
    } while (iVar3 < 0x10);
  }
  uVar10 = this->m_bit_buf;
  if (uVar10 >> 0x10 < pdVar4->m_table_max_code) {
    uVar11 = pdVar4->m_lookup[uVar10 >> (-(char)pdVar4->m_table_bits & 0x1fU)] & 0xffff;
    uVar7 = pdVar4->m_lookup[uVar10 >> (-(char)pdVar4->m_table_bits & 0x1fU)] >> 0x10;
  }
  else {
    iVar3 = pdVar4->m_decode_start_code_size - 0x21;
    do {
      iVar8 = iVar3;
      iVar3 = iVar8 + 1;
    } while (pdVar4->m_max_codes[iVar8 + 0x20U] <= uVar10 >> 0x10);
    lVar6 = (long)(int)(uVar10 >> (-(char)(iVar8 + 1) & 0x1fU)) +
            (long)pdVar4->m_val_ptrs[iVar8 + 0x20U];
    if (model->m_total_syms <= (uint)lVar6) {
      return 0;
    }
    uVar11 = (uint)pdVar4->m_sorted_symbol_order[lVar6];
    uVar7 = iVar8 + 0x21;
  }
  this->m_bit_buf = uVar10 << ((byte)uVar7 & 0x1f);
  this->m_bit_count = iVar12 - uVar7;
  puVar5 = (model->m_sym_freq).m_p;
  uVar2 = puVar5[uVar11];
  puVar5[uVar11] = (unsigned_short)(uVar2 + 1);
  if (uVar2 + 1 == 0xffff) {
    uVar10 = model->m_total_syms;
    if ((ulong)uVar10 == 0) {
      uVar9 = 0;
    }
    else {
      uVar13 = 0;
      uVar9 = 0;
      do {
        uVar7 = puVar5[uVar13] + 1 >> 1;
        uVar9 = uVar9 + uVar7;
        puVar5[uVar13] = (unsigned_short)uVar7;
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
    }
    model->m_total_count = uVar9;
  }
  puVar1 = &model->m_symbols_until_update;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    this->m_total_model_updates = this->m_total_model_updates + 1;
    adaptive_huffman_data_model::update(model);
  }
  return uVar11;
}

Assistant:

uint symbol_codec::decode(adaptive_huffman_data_model& model)
    {
        CRNLIB_ASSERT(m_mode == cDecoding);
        CRNLIB_ASSERT(!model.m_encoding);

        const prefix_coding::decoder_tables* pTables = model.m_pDecode_tables;

        while (m_bit_count < (cBitBufSize - 8))
        {
            uint c = 0;
            if (m_pDecode_buf_next == m_pDecode_buf_end)
            {
                if (!m_decode_buf_eof)
                {
                    m_pDecode_need_bytes_func(m_pDecode_buf_next - m_pDecode_buf, m_pDecode_private_data, m_pDecode_buf, m_decode_buf_size, m_decode_buf_eof);
                    m_pDecode_buf_end = m_pDecode_buf + m_decode_buf_size;
                    m_pDecode_buf_next = m_pDecode_buf;
                    if (m_pDecode_buf_next < m_pDecode_buf_end)
                    {
                        c = *m_pDecode_buf_next++;
                    }
                }
            }
            else
            {
                c = *m_pDecode_buf_next++;
            }

            m_bit_count += 8;
            m_bit_buf |= (static_cast<bit_buf_t>(c) << (cBitBufSize - m_bit_count));
        }

        uint k = static_cast<uint>((m_bit_buf >> (cBitBufSize - 16)) + 1);
        uint sym, len;

        if (k <= pTables->m_table_max_code)
        {
            uint32 t = pTables->m_lookup[m_bit_buf >> (cBitBufSize - pTables->m_table_bits)];

            CRNLIB_ASSERT(t != cUINT32_MAX);
            sym = t & cUINT16_MAX;
            len = t >> 16;

            CRNLIB_ASSERT(model.m_code_sizes[sym] == len);
        }
        else
        {
            len = pTables->m_decode_start_code_size;

            for (;;)
            {
                if (k <= pTables->m_max_codes[len - 1])
                {
                    break;
                }
                len++;
            }

            int val_ptr = pTables->m_val_ptrs[len - 1] + static_cast<int>((m_bit_buf >> (cBitBufSize - len)));

            if (((uint)val_ptr >= model.m_total_syms))
            {
                // corrupted stream, or a bug
                CRNLIB_ASSERT(0);
                return 0;
            }

            sym = pTables->m_sorted_symbol_order[val_ptr];
        }

        m_bit_buf <<= len;
        m_bit_count -= len;

        uint freq = model.m_sym_freq[sym];
        freq++;
        model.m_sym_freq[sym] = static_cast<uint16>(freq);

        if (freq == cUINT16_MAX)
        {
            model.rescale();
        }

        if (--model.m_symbols_until_update == 0)
        {
            m_total_model_updates++;
            model.update();
        }

        return sym;
    }